

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O0

shared_ptr<kratos::AssignStmt> __thiscall kratos::Stmt::as<kratos::AssignStmt>(Stmt *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::AssignStmt> sVar1;
  enable_shared_from_this<kratos::Stmt> local_28;
  Stmt *this_local;
  
  this_local = this;
  std::enable_shared_from_this<kratos::Stmt>::shared_from_this(&local_28);
  std::static_pointer_cast<kratos::AssignStmt,kratos::Stmt>((shared_ptr<kratos::Stmt> *)this);
  std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&local_28);
  sVar1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::AssignStmt>)
         sVar1.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> as() {
        return std::static_pointer_cast<T>(shared_from_this());
    }